

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O1

REF_STATUS ref_migrate_2d_agglomeration_keep(REF_MIGRATE ref_migrate,REF_INT keep,REF_INT lose)

{
  REF_NODE pRVar1;
  REF_GLOB *pRVar2;
  REF_ADJ ref_adj;
  REF_GLOB *pRVar3;
  REF_ADJ pRVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 uVar7;
  long lVar8;
  char *pcVar9;
  REF_INT RVar10;
  int iVar11;
  
  if (-1 < keep) {
    pRVar1 = ref_migrate->grid->node;
    if ((keep < pRVar1->max) && (pRVar2 = pRVar1->global, -1 < pRVar2[(uint)keep])) {
      if ((-1 < lose) && ((lose < pRVar1->max && (-1 < pRVar2[(uint)lose])))) {
        ref_adj = ref_migrate->conn;
        pRVar3 = ref_migrate->global;
        pRVar3[(uint)lose] = -1;
        pRVar4 = ref_migrate->parent_local;
        uVar6 = 0xffffffff;
        if (keep < pRVar4->nnode) {
          uVar6 = (ulong)(uint)pRVar4->first[(uint)keep];
        }
        if ((int)uVar6 != -1) {
          RVar10 = pRVar4->item[(int)uVar6].ref;
          lVar8 = -1;
          if (-1 < pRVar2[(uint)lose]) {
            lVar8 = pRVar2[(uint)lose];
          }
          do {
            if (pRVar3[RVar10] == lVar8) {
              return 0;
            }
            iVar11 = pRVar4->item[(int)uVar6].next;
            uVar6 = (ulong)iVar11;
            if (uVar6 == 0xffffffffffffffff) {
              RVar10 = -1;
            }
            else {
              RVar10 = pRVar4->item[uVar6].ref;
            }
          } while (iVar11 != -1);
        }
        RVar10 = -1;
        uVar6 = 0xffffffff;
        if (lose < ref_adj->nnode) {
          uVar6 = (ulong)(uint)ref_adj->first[(uint)lose];
        }
        iVar11 = (int)uVar6;
        if (iVar11 != -1) {
          RVar10 = ref_adj->item[iVar11].ref;
        }
        while (iVar11 != -1) {
          uVar5 = ref_adj_remove(ref_adj,RVar10,lose);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,0xc5,"ref_migrate_2d_agglomeration_keep",(ulong)uVar5,"rm to lose");
            return uVar5;
          }
          if (RVar10 != keep) {
            uVar5 = ref_adj_add_uniquely(ref_adj,RVar10,keep);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,199,"ref_migrate_2d_agglomeration_keep",(ulong)uVar5,"add to keep");
              return uVar5;
            }
            uVar5 = ref_adj_add_uniquely(ref_adj,keep,RVar10);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,200,"ref_migrate_2d_agglomeration_keep",(ulong)uVar5,"add to keep");
              return uVar5;
            }
          }
          iVar11 = ref_adj->item[(int)uVar6].next;
          uVar6 = (ulong)iVar11;
          if (uVar6 == 0xffffffffffffffff) {
            RVar10 = -1;
          }
          else {
            RVar10 = ref_adj->item[uVar6].ref;
          }
        }
        while ((lose < ref_adj->nnode && ((long)ref_adj->first[(uint)lose] != -1))) {
          uVar5 = ref_adj_remove(ref_adj,lose,ref_adj->item[ref_adj->first[(uint)lose]].ref);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,0xd1,"ref_migrate_2d_agglomeration_keep",(ulong)uVar5,"rm from lose");
            return uVar5;
          }
        }
        if (ref_migrate->global[(uint)keep] == -1) {
          return 0;
        }
        ref_migrate->xyz[(ulong)(uint)(keep * 3) + 1] = 0.5;
        ref_migrate->weight[(uint)keep] = 2.0;
        uVar5 = ref_adj_add(ref_migrate->parent_local,keep,lose);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0xda,"ref_migrate_2d_agglomeration_keep",(ulong)uVar5,"add");
          return uVar5;
        }
        uVar5 = ref_adj_add(ref_migrate->parent_part,keep,pRVar1->part[(uint)lose]);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0xdd,"ref_migrate_2d_agglomeration_keep",(ulong)uVar5,"add");
          return uVar5;
        }
        return 0;
      }
      pcVar9 = "lose node invalid";
      uVar7 = 0xb7;
      goto LAB_00210092;
    }
  }
  pcVar9 = "keep node invalid";
  uVar7 = 0xb6;
LAB_00210092:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar7,
         "ref_migrate_2d_agglomeration_keep",pcVar9);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_2d_agglomeration_keep(REF_MIGRATE ref_migrate,
                                                     REF_INT keep,
                                                     REF_INT lose) {
  REF_NODE ref_node = ref_grid_node(ref_migrate_grid(ref_migrate));
  REF_ADJ conn_adj = ref_migrate_conn(ref_migrate);
  REF_INT item, local;
  REF_GLOB global;
  REF_INT from_node;

  /* not working for general agglomeration, ghost lose? */

  RAS(ref_node_valid(ref_node, keep), "keep node invalid");
  RAS(ref_node_valid(ref_node, lose), "lose node invalid");

  ref_migrate_global(ref_migrate, lose) = REF_EMPTY;

  /* skip if the lose node has been agglomerated */
  each_ref_adj_node_item_with_ref(ref_migrate_parent_local(ref_migrate), keep,
                                  item, local) {
    global = ref_migrate_global(ref_migrate, local);
    if (global == ref_node_global(ref_node, lose)) {
      return REF_SUCCESS;
    }
  }
  /* update edges pointing to lose node */
  each_ref_adj_node_item_with_ref(conn_adj, lose, item, from_node) {
    RSS(ref_adj_remove(conn_adj, from_node, lose), "rm to lose");
    if (from_node != keep) {
      RSS(ref_adj_add_uniquely(conn_adj, from_node, keep), "add to keep");
      RSS(ref_adj_add_uniquely(conn_adj, keep, from_node), "add to keep");
    }
  }

  /* update edges pointing from lose node */
  while (ref_adj_valid(ref_adj_first(conn_adj, lose))) {
    RSS(ref_adj_remove(
            conn_adj, lose,
            ref_adj_item_ref(conn_adj, ref_adj_first(conn_adj, lose))),
        "rm from lose");
  }

  /* skip if keep node is off-proc or already agglomerated */
  if (!ref_migrate_valid(ref_migrate, keep)) return REF_SUCCESS;

  ref_migrate_xyz(ref_migrate, 1, keep) = 0.5;
  ref_migrate_weight(ref_migrate, keep) = 2.0;
  /* collect age in general case */
  RSS(ref_adj_add(ref_migrate_parent_local(ref_migrate), keep, lose), "add");
  RSS(ref_adj_add(ref_migrate_parent_part(ref_migrate), keep,
                  ref_node_part(ref_node, lose)),
      "add");

  return REF_SUCCESS;
}